

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath.cpp
# Opt level: O0

QPainterPath __thiscall QPainterPath::toReversed(QPainterPath *this)

{
  int iVar1;
  bool bVar2;
  QPainterPathPrivate *pQVar3;
  const_reference pEVar4;
  qsizetype qVar5;
  const_reference this_00;
  const_reference ctrlPt1y;
  qreal in_RSI;
  QExplicitlySharedDataPointer<QPainterPathPrivate> in_RDI;
  Element *sp;
  Element *cp1;
  Element *prev;
  Element *elm;
  int i;
  QPainterPathPrivate *d;
  QPainterPath *rev;
  qsizetype in_stack_ffffffffffffff78;
  undefined1 *i_00;
  undefined4 in_stack_ffffffffffffff80;
  ElementType in_stack_ffffffffffffff84;
  QPainterPath *in_stack_ffffffffffffff88;
  QList<QPainterPath::Element> *y;
  QPainterPath *in_stack_ffffffffffffff90;
  QList<QPainterPath::Element> *x;
  QPainterPath *this_01;
  QPainterPathPrivate *ctrlPt2y;
  int local_24;
  
  ctrlPt2y = (QPainterPathPrivate *)in_RDI.d.ptr;
  pQVar3 = d_func((QPainterPath *)0x5b9604);
  *(undefined1 **)ctrlPt2y = &DAT_aaaaaaaaaaaaaaaa;
  QPainterPath((QPainterPath *)0x5b9622);
  bVar2 = isEmpty(in_stack_ffffffffffffff90);
  if (bVar2) {
    operator=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  else {
    y = &pQVar3->elements;
    QList<QPainterPath::Element>::size(&pQVar3->elements);
    pEVar4 = QList<QPainterPath::Element>::at
                       ((QList<QPainterPath::Element> *)
                        CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                        in_stack_ffffffffffffff78);
    this_01 = (QPainterPath *)pEVar4->x;
    x = &pQVar3->elements;
    QList<QPainterPath::Element>::size(&pQVar3->elements);
    QList<QPainterPath::Element>::at
              ((QList<QPainterPath::Element> *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff78);
    moveTo(this_01,(qreal)x,(qreal)y);
    qVar5 = QList<QPainterPath::Element>::size(&pQVar3->elements);
    local_24 = (int)qVar5;
    while (iVar1 = local_24, local_24 = iVar1 + -1, 0 < local_24) {
      i_00 = &DAT_aaaaaaaaaaaaaaaa;
      pEVar4 = QList<QPainterPath::Element>::at
                         ((QList<QPainterPath::Element> *)
                          CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          -0x5555555555555556);
      this_00 = QList<QPainterPath::Element>::at
                          ((QList<QPainterPath::Element> *)
                           CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                           (qsizetype)i_00);
      in_stack_ffffffffffffff84 = pEVar4->type;
      if (in_stack_ffffffffffffff84 == MoveToElement) {
        moveTo(this_01,(qreal)x,(qreal)y);
      }
      else if (in_stack_ffffffffffffff84 == LineToElement) {
        lineTo(this_01,(qreal)x,(qreal)y);
      }
      else if (in_stack_ffffffffffffff84 == CurveToDataElement) {
        pEVar4 = QList<QPainterPath::Element>::at
                           ((QList<QPainterPath::Element> *)CONCAT44(3,in_stack_ffffffffffffff80),
                            (qsizetype)i_00);
        ctrlPt1y = QList<QPainterPath::Element>::at
                             ((QList<QPainterPath::Element> *)
                              CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                              (qsizetype)i_00);
        cubicTo((QPainterPath *)this_00,(qreal)pEVar4,(qreal)ctrlPt1y,in_RSI,(qreal)ctrlPt2y,
                (qreal)in_RDI.d.ptr,(qreal)this_01);
        local_24 = iVar1 + -3;
      }
    }
  }
  return (QExplicitlySharedDataPointer<QPainterPathPrivate>)
         (QExplicitlySharedDataPointer<QPainterPathPrivate>)in_RDI.d.ptr;
}

Assistant:

QPainterPath QPainterPath::toReversed() const
{
    Q_D(const QPainterPath);
    QPainterPath rev;

    if (isEmpty()) {
        rev = *this;
        return rev;
    }

    rev.moveTo(d->elements.at(d->elements.size()-1).x, d->elements.at(d->elements.size()-1).y);

    for (int i=d->elements.size()-1; i>=1; --i) {
        const QPainterPath::Element &elm = d->elements.at(i);
        const QPainterPath::Element &prev = d->elements.at(i-1);
        switch (elm.type) {
        case LineToElement:
            rev.lineTo(prev.x, prev.y);
            break;
        case MoveToElement:
            rev.moveTo(prev.x, prev.y);
            break;
        case CurveToDataElement:
            {
                Q_ASSERT(i>=3);
                const QPainterPath::Element &cp1 = d->elements.at(i-2);
                const QPainterPath::Element &sp = d->elements.at(i-3);
                Q_ASSERT(prev.type == CurveToDataElement);
                Q_ASSERT(cp1.type == CurveToElement);
                rev.cubicTo(prev.x, prev.y, cp1.x, cp1.y, sp.x, sp.y);
                i -= 2;
                break;
            }
        default:
            Q_ASSERT(!"qt_reversed_path");
            break;
        }
    }
    //qt_debug_path(rev);
    return rev;
}